

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void hwnet::TCPSocket::onTimer(Ptr *t,Ptr *s)

{
  Poller *this;
  bool bVar1;
  long lVar2;
  element_type *peVar3;
  code *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  _Tuple_impl<0UL,_std::shared_ptr<hwnet::TCPSocket>,_std::shared_ptr<hwnet::util::Timer>_> local_70
  ;
  value_type local_50;
  
  std::mutex::lock(&((s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    mtx);
  peVar3 = (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((peVar3->sendTimeout == 0) ||
      ((peVar3->sendTimeoutCallback_).super__Function_base._M_manager == (_Manager_type)0x0)) ||
     (peVar3->ptrSendlist->head == (sendContext *)0x0)) {
LAB_0011a8a9:
    bVar1 = false;
  }
  else {
    lVar2 = std::chrono::_V2::steady_clock::now();
    peVar3 = (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((ulong)(lVar2 - (peVar3->lastSendTime).__d.__r) <= peVar3->sendTimeout * 1000000)
    goto LAB_0011a8a9;
    local_90 = checkTimeout;
    local_88 = 0;
    std::
    _Bind<void(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>
    ::_Bind<std::shared_ptr<hwnet::TCPSocket>&,std::shared_ptr<hwnet::util::Timer>const&>
              ((_Bind<void(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>
                *)local_80,(offset_in_TCPSocket_to_subr *)&local_90,s,t);
    std::function<void()>::
    function<std::_Bind<void(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>,void>
              ((function<void()> *)&local_50,
               (_Bind<void_(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,_std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>
                *)local_80);
    std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              (&peVar3->closures,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::_Tuple_impl<0UL,_std::shared_ptr<hwnet::TCPSocket>,_std::shared_ptr<hwnet::util::Timer>_>::
    ~_Tuple_impl(&local_70);
    peVar3 = (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar3->doing != false) goto LAB_0011a8a9;
    peVar3->doing = true;
    bVar1 = true;
  }
  if (((peVar3->recvTimeout != 0) &&
      ((peVar3->recvTimeoutCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) &&
     ((peVar3->recvList).
      super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&peVar3->recvList)) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    peVar3 = (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar3->recvTimeout * 1000000 < (ulong)(lVar2 - (peVar3->lastRecvTime).__d.__r)) {
      local_90 = checkTimeout;
      local_88 = 0;
      std::
      _Bind<void(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>
      ::_Bind<std::shared_ptr<hwnet::TCPSocket>&,std::shared_ptr<hwnet::util::Timer>const&>
                ((_Bind<void(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>
                  *)local_80,(offset_in_TCPSocket_to_subr *)&local_90,s,t);
      std::function<void()>::
      function<std::_Bind<void(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>,void>
                ((function<void()> *)&local_50,
                 (_Bind<void_(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,_std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>
                  *)local_80);
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
      push_back(&peVar3->closures,&local_50);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
      std::_Tuple_impl<0UL,_std::shared_ptr<hwnet::TCPSocket>,_std::shared_ptr<hwnet::util::Timer>_>
      ::~_Tuple_impl(&local_70);
      peVar3 = (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar3->doing == false) {
        peVar3->doing = true;
        pthread_mutex_unlock((pthread_mutex_t *)&peVar3->mtx);
        goto LAB_0011a975;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&peVar3->mtx);
  if (!bVar1) {
    return;
  }
LAB_0011a975:
  this = ((s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->poller_;
  std::__shared_ptr<hwnet::Task,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<hwnet::TCPSocket,void>
            ((__shared_ptr<hwnet::Task,(__gnu_cxx::_Lock_policy)2> *)local_80,
             &s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>);
  Poller::PostTask(this,(Ptr *)local_80,
                   ((s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   pool_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  return;
}

Assistant:

void TCPSocket::onTimer(const hwnet::util::Timer::Ptr &t,TCPSocket::Ptr s) {
	auto post = false;

	s->mtx.lock();
	
	if(s->sendTimeout > 0 && 
	   s->sendTimeoutCallback_ && !s->ptrSendlist->empty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - s->lastSendTime).count()) > s->sendTimeout*1000000) {
		s->closures.push_back(std::bind(&TCPSocket::checkTimeout, s,t));
		if(!s->doing){
			s->doing = true;
			post = true;
		}
	}

	if(s->recvTimeout > 0 && 
	   s->recvTimeoutCallback_ && !s->recvListEmpty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - s->lastRecvTime).count()) > s->recvTimeout*1000000) {
		s->closures.push_back(std::bind(&TCPSocket::checkTimeout, s,t));
		if(!s->doing){
			s->doing = true;
			post = true;
		}
	}


	s->mtx.unlock();

	if(post) {
		s->poller_->PostTask(s,s->pool_);
	}

}